

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::sampler_is_supported(Impl *this,VkSamplerCreateInfo *info)

{
  size_type sVar1;
  bool bVar2;
  allocator local_99;
  key_type local_98;
  byte local_73;
  byte local_72;
  allocator local_71;
  key_type local_70;
  byte local_4b;
  byte local_4a;
  allocator local_49;
  key_type local_48;
  undefined4 local_24;
  VkSamplerCreateInfo *pVStack_20;
  VkSamplerCreateFlags supported_flags;
  VkSamplerCreateInfo *info_local;
  Impl *this_local;
  
  local_24 = 0x17;
  if ((info->flags & 0xffffffe8) == 0) {
    if ((this->null_device & 1U) == 0) {
      if (((info->flags & 4) == 0) ||
         ((this->features).non_seamless_cube_map.nonSeamlessCubeMap != 0)) {
        local_4a = 0;
        local_4b = 0;
        pVStack_20 = info;
        info_local = (VkSamplerCreateInfo *)this;
        if (((info->addressModeU == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE) ||
            (info->addressModeV == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE)) ||
           (bVar2 = false, info->addressModeW == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE)) {
          std::allocator<char>::allocator();
          local_4a = 1;
          std::__cxx11::string::string
                    ((string *)&local_48,"VK_KHR_sampler_mirror_clamp_to_edge",&local_49);
          local_4b = 1;
          sVar1 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->enabled_extensions,&local_48);
          bVar2 = sVar1 == 0;
        }
        if ((local_4b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_48);
        }
        if ((local_4a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_49);
        }
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          local_72 = 0;
          local_73 = 0;
          if ((pVStack_20->minFilter == VK_FILTER_CUBIC_EXT) ||
             (bVar2 = false, pVStack_20->magFilter == VK_FILTER_CUBIC_EXT)) {
            std::allocator<char>::allocator();
            local_72 = 1;
            std::__cxx11::string::string((string *)&local_70,"VK_IMG_filter_cubic",&local_71);
            local_73 = 1;
            sVar1 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->enabled_extensions,&local_70);
            bVar2 = sVar1 == 0;
          }
          if ((local_73 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_70);
          }
          if ((local_72 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_71);
          }
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else if (((pVStack_20->flags & 3) == 0) ||
                  ((this->features).fragment_density.fragmentDensityMap != 0)) {
            if (((pVStack_20->borderColor == VK_BORDER_COLOR_FLOAT_CUSTOM_EXT) ||
                (pVStack_20->borderColor == VK_BORDER_COLOR_INT_CUSTOM_EXT)) &&
               ((this->features).custom_border_color.customBorderColors == 0)) {
              this_local._7_1_ = false;
            }
            else {
              bVar2 = false;
              if ((pVStack_20->flags & 0x10) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_98,"VK_QCOM_image_processing",&local_99);
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,&local_98);
                bVar2 = sVar1 == 0;
                std::__cxx11::string::~string((string *)&local_98);
                std::allocator<char>::~allocator((allocator<char> *)&local_99);
              }
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = pnext_chain_is_supported(this,pVStack_20->pNext);
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::sampler_is_supported(const VkSamplerCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkSamplerCreateFlags supported_flags =
			VK_SAMPLER_CREATE_NON_SEAMLESS_CUBE_MAP_BIT_EXT |
			VK_SAMPLER_CREATE_SUBSAMPLED_BIT_EXT |
			VK_SAMPLER_CREATE_SUBSAMPLED_COARSE_RECONSTRUCTION_BIT_EXT |
			VK_SAMPLER_CREATE_IMAGE_PROCESSING_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((info->flags & VK_SAMPLER_CREATE_NON_SEAMLESS_CUBE_MAP_BIT_EXT) != 0)
		if (!features.non_seamless_cube_map.nonSeamlessCubeMap)
			return false;

	if ((info->addressModeU == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE ||
	     info->addressModeV == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE ||
	     info->addressModeW == VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE) &&
	    enabled_extensions.count(VK_KHR_SAMPLER_MIRROR_CLAMP_TO_EDGE_EXTENSION_NAME) == 0)
		return false;

	if ((info->minFilter == VK_FILTER_CUBIC_IMG ||
	     info->magFilter == VK_FILTER_CUBIC_IMG) &&
	    enabled_extensions.count(VK_IMG_FILTER_CUBIC_EXTENSION_NAME) == 0)
		return false;

	if ((info->flags & (VK_SAMPLER_CREATE_SUBSAMPLED_BIT_EXT |
	                    VK_SAMPLER_CREATE_SUBSAMPLED_COARSE_RECONSTRUCTION_BIT_EXT)) != 0 &&
	    features.fragment_density.fragmentDensityMap == VK_FALSE)
		return false;

	if ((info->borderColor == VK_BORDER_COLOR_FLOAT_CUSTOM_EXT ||
	     info->borderColor == VK_BORDER_COLOR_INT_CUSTOM_EXT) &&
	    features.custom_border_color.customBorderColors == VK_FALSE)
		return false;

	if ((info->flags & VK_SAMPLER_CREATE_IMAGE_PROCESSING_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_IMAGE_PROCESSING_EXTENSION_NAME) == 0)
		return false;

	return pnext_chain_is_supported(info->pNext);
}